

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O3

CURLcode set_trace_config(GlobalConfig *global,char *token)

{
  bool bVar1;
  ushort uVar2;
  int iVar3;
  CURLcode CVar4;
  char *pcVar5;
  ushort uVar6;
  size_t sVar7;
  char *pcVar8;
  char buffer [32];
  char acStack_58 [40];
  
  if (token == (char *)0x0) {
    return CURLE_OK;
  }
  do {
    pcVar5 = strchr(token,0x2c);
    if (pcVar5 == (char *)0x0) {
      sVar7 = strlen(token);
    }
    else {
      sVar7 = (long)pcVar5 - (long)token;
    }
    bVar1 = true;
    if (*token == '+') {
      sVar7 = sVar7 - 1;
      pcVar8 = token + 1;
    }
    else {
      pcVar8 = token;
      if (*token == '-') {
        sVar7 = sVar7 - 1;
        bVar1 = false;
        pcVar8 = token + 1;
      }
    }
    if (sVar7 == 4) {
      iVar3 = curl_strnequal(pcVar8,"time",4);
      if (iVar3 == 0) goto LAB_001122ed;
      uVar2 = 0xffdf;
      uVar6 = 0x20;
LAB_001122d6:
      if (bVar1 == false) {
        uVar6 = 0;
      }
      *(ushort *)&global->field_0x63 = uVar2 & *(ushort *)&global->field_0x63 | uVar6;
    }
    else {
      if (sVar7 == 3) {
        iVar3 = curl_strnequal(pcVar8,"all",3);
        if (iVar3 == 0) {
          iVar3 = curl_strnequal(pcVar8,"ids",3);
          if (iVar3 != 0) {
            uVar2 = 0xffbf;
            uVar6 = 0x40;
            goto LAB_001122d6;
          }
          goto LAB_001122ed;
        }
        uVar2 = 0;
        if (bVar1) {
          uVar2 = 0x60;
        }
        *(ushort *)&global->field_0x63 = uVar2 | *(ushort *)&global->field_0x63 & 0xff9f;
      }
      else {
LAB_001122ed:
        curl_msnprintf(acStack_58,0x20,"%c%.*s",(bVar1 ^ 1U) * '\x02' + '+',sVar7 & 0xffffffff,
                       pcVar8);
        token = acStack_58;
      }
      CVar4 = curl_global_trace(token);
      if (CVar4 != CURLE_OK) {
        return CVar4;
      }
    }
    if (pcVar5 == (char *)0x0) {
      token = (char *)0x0;
    }
    else {
      token = pcVar5 + 2;
      if (pcVar5[1] != ' ') {
        token = pcVar5 + 1;
      }
    }
    if (token == (char *)0x0) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

static CURLcode set_trace_config(struct GlobalConfig *global,
                                 const char *token)
{
  CURLcode result = CURLE_OK;
  const char *next, *name;
  bool toggle;

  while(token) {
    size_t len;
    next = strchr(token, ',');

    if(next)
      len = next - token;
    else
      len = strlen(token);

    switch(*token) {
      case '-':
        toggle = FALSE;
        name = token + 1;
        len--;
        break;
      case '+':
        toggle = TRUE;
        name = token + 1;
        len--;
        break;
      default:
        toggle = TRUE;
        name = token;
        break;
    }

    if((len == 3) && strncasecompare(name, "all", 3)) {
      global->traceids = toggle;
      global->tracetime = toggle;
      result = curl_global_trace(token);
      if(result)
        goto out;
    }
    else if((len == 3) && strncasecompare(name, "ids", 3)) {
      global->traceids = toggle;
    }
    else if((len == 4) && strncasecompare(name, "time", 4)) {
      global->tracetime = toggle;
    }
    else {
      char buffer[32];
      msnprintf(buffer, sizeof(buffer), "%c%.*s", toggle ? '+' : '-',
                (int)len, name);
      result = curl_global_trace(buffer);
      if(result)
        goto out;
    }
    if(next) {
      next++;
      if(*next == ' ')
        next++;
    }
    token = next;
  }
out:
  return result;
}